

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial.cpp
# Opt level: O1

int __thiscall
embree::SceneLoadingTutorialApplication::main
          (SceneLoadingTutorialApplication *this,int argc,char **argv)

{
  undefined1 *this_00;
  _Any_data *p_Var1;
  pointer pFVar2;
  GroupNode *pGVar3;
  pointer pSVar4;
  PerspectiveCameraNode *pPVar5;
  pointer pRVar6;
  Application *pAVar7;
  int iVar8;
  ostream *poVar9;
  runtime_error *this_01;
  char **extraout_RDX;
  char **extraout_RDX_00;
  char **argv_00;
  long lVar10;
  ulong uVar11;
  iterator __begin3;
  _Any_data *p_Var12;
  pointer pFVar13;
  pointer pSVar14;
  bool bVar15;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  Ref<embree::SceneGraph::PerspectiveCameraNode> cam;
  Ref<embree::SceneGraph::GroupNode> flattened_scene;
  undefined1 local_168 [32];
  string local_148;
  undefined1 local_128 [8];
  float fStack_120;
  float fStack_11c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  string *local_68;
  Ref<embree::SceneGraph::GroupNode> local_60;
  Ref<embree::SceneGraph::Node> local_58;
  Ref<embree::SceneGraph::GroupNode> local_50;
  Ref<embree::SceneGraph::Node> local_48;
  Ref<embree::SceneGraph::Node> local_40;
  Ref<embree::SceneGraph::Node> local_38;
  
  CommandLineParser::parseCommandLine
            (&(this->super_TutorialApplication).super_Application.commandLineParser,argc,argv);
  (*(this->super_TutorialApplication).super_Application._vptr_Application[3])(this);
  TutorialApplication::create_device(&this->super_TutorialApplication);
  local_128 = (undefined1  [8])(local_128 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"application start","");
  Application::log((Application *)this,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
  if (local_128 != (undefined1  [8])(local_128 + 0x10)) {
    operator_delete((void *)local_128);
  }
  p_Var12 = (_Any_data *)
            (this->futures).
            super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  p_Var1 = (_Any_data *)
           (this->futures).
           super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  do {
    if (p_Var12 == p_Var1) {
      pFVar13 = (this->sceneFilename).
                super__Vector_base<embree::FileName,_std::allocator<embree::FileName>_>._M_impl.
                super__Vector_impl_data._M_start;
      pFVar2 = (this->sceneFilename).
               super__Vector_base<embree::FileName,_std::allocator<embree::FileName>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (pFVar2 != pFVar13) {
        local_68 = &this->subdiv_mode;
        do {
          FileName::ext_abi_cxx11_(&local_148,pFVar13);
          toLowerCase((string *)local_128,&local_148);
          local_168._0_8_ = local_168 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"obj","");
          pRVar6 = (pointer)CONCAT44(fStack_11c,fStack_120);
          if (pRVar6 == (pointer)local_168._8_8_) {
            if (pRVar6 == (pointer)0x0) {
              bVar15 = true;
            }
            else {
              iVar8 = bcmp((void *)local_128,(void *)local_168._0_8_,(size_t)pRVar6);
              bVar15 = iVar8 == 0;
            }
          }
          else {
            bVar15 = false;
          }
          if ((PerspectiveCameraNode *)local_168._0_8_ !=
              (PerspectiveCameraNode *)(local_168 + 0x10)) {
            operator_delete((void *)local_168._0_8_);
          }
          if (local_128 != (undefined1  [8])(local_128 + 0x10)) {
            operator_delete((void *)local_128);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != &local_148.field_2) {
            operator_delete(local_148._M_dataplus._M_p);
          }
          if (bVar15) {
            pGVar3 = (this->scene).ptr;
            iVar8 = std::__cxx11::string::compare((char *)local_68);
            loadOBJ((embree *)local_128,pFVar13,iVar8 != 0,false);
            if (local_128 != (undefined1  [8])0x0) {
              std::
              vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
              ::push_back(&pGVar3->children,(value_type *)local_128);
            }
            if (local_128 != (undefined1  [8])0x0) {
              (*(code *)((*(Node **)local_128)->fileName)._M_string_length)();
            }
          }
          else {
            FileName::ext_abi_cxx11_((string *)local_128,pFVar13);
            iVar8 = std::__cxx11::string::compare((char *)local_128);
            if (local_128 != (undefined1  [8])(local_128 + 0x10)) {
              operator_delete((void *)local_128);
            }
            if (iVar8 != 0) {
              pGVar3 = (this->scene).ptr;
              SceneGraph::load((SceneGraph *)local_128,pFVar13,false);
              if (local_128 != (undefined1  [8])0x0) {
                std::
                vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                ::push_back(&pGVar3->children,(value_type *)local_128);
              }
              if (local_128 != (undefined1  [8])0x0) {
                (*(code *)((*(Node **)local_128)->fileName)._M_string_length)();
              }
            }
          }
          pFVar13 = pFVar13 + 1;
        } while (pFVar13 != pFVar2);
      }
      pAVar7 = Application::instance;
      local_128 = (undefined1  [8])(local_128 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"loading scene done","");
      Application::log(pAVar7,(double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
      if (local_128 != (undefined1  [8])(local_128 + 0x10)) {
        operator_delete((void *)local_128);
      }
      if ((this->keyFramesFilenames).
          super__Vector_base<embree::FileName,_std::allocator<embree::FileName>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          (this->keyFramesFilenames).
          super__Vector_base<embree::FileName,_std::allocator<embree::FileName>_>._M_impl.
          super__Vector_impl_data._M_start) {
        local_68 = &this->subdiv_mode;
        lVar10 = 0;
        uVar11 = 0;
        do {
          if (0 < (this->super_TutorialApplication).super_Application.verbosity) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Adding [",8);
            poVar9 = operator<<((ostream *)&std::cout,
                                (FileName *)
                                ((long)&(((this->keyFramesFilenames).
                                          super__Vector_base<embree::FileName,_std::allocator<embree::FileName>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->filename).
                                        _M_dataplus._M_p + lVar10));
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"] to scene...",0xd);
            std::ostream::flush();
          }
          FileName::ext_abi_cxx11_
                    (&local_148,
                     (FileName *)
                     ((long)&(((this->keyFramesFilenames).
                               super__Vector_base<embree::FileName,_std::allocator<embree::FileName>_>
                               ._M_impl.super__Vector_impl_data._M_start)->filename)._M_dataplus.
                             _M_p + lVar10));
          toLowerCase((string *)local_128,&local_148);
          local_168._0_8_ = local_168 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"obj","");
          pRVar6 = (pointer)CONCAT44(fStack_11c,fStack_120);
          if (pRVar6 == (pointer)local_168._8_8_) {
            if (pRVar6 == (pointer)0x0) {
              bVar15 = true;
            }
            else {
              iVar8 = bcmp((void *)local_128,(void *)local_168._0_8_,(size_t)pRVar6);
              bVar15 = iVar8 == 0;
            }
          }
          else {
            bVar15 = false;
          }
          if ((PerspectiveCameraNode *)local_168._0_8_ !=
              (PerspectiveCameraNode *)(local_168 + 0x10)) {
            operator_delete((void *)local_168._0_8_);
          }
          if (local_128 != (undefined1  [8])(local_128 + 0x10)) {
            operator_delete((void *)local_128);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != &local_148.field_2) {
            operator_delete(local_148._M_dataplus._M_p);
          }
          if (bVar15) {
            pGVar3 = (this->scene).ptr;
            pFVar13 = (this->keyFramesFilenames).
                      super__Vector_base<embree::FileName,_std::allocator<embree::FileName>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            iVar8 = std::__cxx11::string::compare((char *)local_68);
            loadOBJ((embree *)local_128,
                    (FileName *)((long)&(pFVar13->filename)._M_dataplus._M_p + lVar10),iVar8 != 0,
                    true);
            if (local_128 != (undefined1  [8])0x0) {
              std::
              vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
              ::push_back(&pGVar3->children,(value_type *)local_128);
            }
            if (local_128 != (undefined1  [8])0x0) {
              (*(code *)((*(Node **)local_128)->fileName)._M_string_length)();
            }
          }
          else {
            FileName::ext_abi_cxx11_
                      ((string *)local_128,
                       (FileName *)
                       ((long)&(((this->keyFramesFilenames).
                                 super__Vector_base<embree::FileName,_std::allocator<embree::FileName>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->filename)._M_dataplus.
                               _M_p + lVar10));
            iVar8 = std::__cxx11::string::compare((char *)local_128);
            if (local_128 != (undefined1  [8])(local_128 + 0x10)) {
              operator_delete((void *)local_128);
            }
            if (iVar8 != 0) {
              pGVar3 = (this->scene).ptr;
              SceneGraph::load((SceneGraph *)local_128,
                               (FileName *)
                               ((long)&(((this->keyFramesFilenames).
                                         super__Vector_base<embree::FileName,_std::allocator<embree::FileName>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->filename).
                                       _M_dataplus._M_p + lVar10),false);
              if (local_128 != (undefined1  [8])0x0) {
                std::
                vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                ::push_back(&pGVar3->children,(value_type *)local_128);
              }
              if (local_128 != (undefined1  [8])0x0) {
                (*(code *)((*(Node **)local_128)->fileName)._M_string_length)();
              }
            }
          }
          if (0 < (this->super_TutorialApplication).super_Application.verbosity) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," [DONE]",7);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
            std::ostream::put(-0x30);
            std::ostream::flush();
            std::ostream::flush();
          }
          uVar11 = uVar11 + 1;
          lVar10 = lVar10 + 0x20;
        } while (uVar11 < (ulong)((long)(this->keyFramesFilenames).
                                        super__Vector_base<embree::FileName,_std::allocator<embree::FileName>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->keyFramesFilenames).
                                        super__Vector_base<embree::FileName,_std::allocator<embree::FileName>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 5));
      }
      Texture::clearTextureCache();
      if (this->remove_mblur == true) {
        SceneGraph::GroupNode::remove_mblur((this->scene).ptr,true);
      }
      if (this->remove_non_mblur == true) {
        SceneGraph::GroupNode::remove_mblur((this->scene).ptr,false);
      }
      if (((this->sgop).
           super__Vector_base<embree::SceneLoadingTutorialApplication::SceneGraphOperations,_std::allocator<embree::SceneLoadingTutorialApplication::SceneGraphOperations>_>
           ._M_impl.super__Vector_impl_data._M_finish !=
           (this->sgop).
           super__Vector_base<embree::SceneLoadingTutorialApplication::SceneGraphOperations,_std::allocator<embree::SceneLoadingTutorialApplication::SceneGraphOperations>_>
           ._M_impl.super__Vector_impl_data._M_start) &&
         (0 < (this->super_TutorialApplication).super_Application.verbosity)) {
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
        std::ostream::put(-0x30);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"scene statistics (pre-convert):",0x1f);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
        std::ostream::put(-0x30);
        std::ostream::flush();
        local_38.ptr = &((this->scene).ptr)->super_Node;
        if ((GroupNode *)local_38.ptr != (GroupNode *)0x0) {
          (*(((Node *)&(local_38.ptr)->super_RefCount)->super_RefCount)._vptr_RefCount[2])();
        }
        SceneGraph::calculateStatistics((Statistics *)local_128,&local_38);
        SceneGraph::Statistics::print((Statistics *)local_128);
        if ((GroupNode *)local_38.ptr != (GroupNode *)0x0) {
          (*(((Node *)&(local_38.ptr)->super_RefCount)->super_RefCount)._vptr_RefCount[3])();
        }
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
        std::ostream::put(-0x30);
        std::ostream::flush();
      }
      pSVar14 = (this->sgop).
                super__Vector_base<embree::SceneLoadingTutorialApplication::SceneGraphOperations,_std::allocator<embree::SceneLoadingTutorialApplication::SceneGraphOperations>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pSVar4 = (this->sgop).
               super__Vector_base<embree::SceneLoadingTutorialApplication::SceneGraphOperations,_std::allocator<embree::SceneLoadingTutorialApplication::SceneGraphOperations>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pSVar14 != pSVar4) {
        do {
          switch(*pSVar14) {
          case CONVERT_TRIANGLES_TO_QUADS:
            SceneGraph::GroupNode::triangles_to_quads
                      ((this->scene).ptr,this->convert_tris_to_quads_prop);
            break;
          case CONVERT_BEZIER_TO_LINES:
            SceneGraph::GroupNode::bezier_to_lines((this->scene).ptr);
            break;
          case CONVERT_BEZIER_TO_BSPLINE:
            SceneGraph::GroupNode::bezier_to_bspline((this->scene).ptr);
            break;
          case CONVERT_BEZIER_TO_HERMITE:
            SceneGraph::GroupNode::bezier_to_hermite((this->scene).ptr);
            break;
          case CONVERT_BSPLINE_TO_BEZIER:
            SceneGraph::GroupNode::bspline_to_bezier((this->scene).ptr);
            break;
          case CONVERT_FLAT_TO_ROUND_CURVES:
            SceneGraph::GroupNode::flat_to_round_curves((this->scene).ptr);
            break;
          case CONVERT_ROUND_TO_FLAT_CURVES:
            SceneGraph::GroupNode::round_to_flat_curves((this->scene).ptr);
            break;
          case MERGE_QUADS_TO_GRIDS:
            SceneGraph::GroupNode::merge_quads_to_grids((this->scene).ptr);
            break;
          case CONVERT_QUADS_TO_GRIDS:
            SceneGraph::GroupNode::quads_to_grids((this->scene).ptr,this->grid_resX,this->grid_resY)
            ;
            break;
          case CONVERT_GRIDS_TO_QUADS:
            SceneGraph::GroupNode::grids_to_quads((this->scene).ptr);
            break;
          case CONVERT_MBLUR_TO_NONMBLUR:
            local_40.ptr = &((this->scene).ptr)->super_Node;
            if ((GroupNode *)local_40.ptr != (GroupNode *)0x0) {
              (*(((Node *)&(local_40.ptr)->super_RefCount)->super_RefCount)._vptr_RefCount[2])();
            }
            SceneGraph::convert_mblur_to_nonmblur(&local_40);
            if ((GroupNode *)local_40.ptr != (GroupNode *)0x0) {
              (*(((Node *)&(local_40.ptr)->super_RefCount)->super_RefCount)._vptr_RefCount[3])();
            }
            break;
          default:
switchD_00127ff0_default:
            this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this_01,"unsupported scene graph operation");
            __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          pSVar14 = pSVar14 + 1;
        } while (pSVar14 != pSVar4);
      }
      pAVar7 = Application::instance;
      local_128 = (undefined1  [8])(local_128 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_128,"converting scene done","");
      Application::log(pAVar7,(double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
      if (local_128 != (undefined1  [8])(local_128 + 0x10)) {
        operator_delete((void *)local_128);
      }
      if (0 < (this->super_TutorialApplication).super_Application.verbosity) {
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
        std::ostream::put(-0x30);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"scene statistics (pre-flattening):",0x22);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
        std::ostream::put(-0x30);
        std::ostream::flush();
        local_48.ptr = &((this->scene).ptr)->super_Node;
        if ((GroupNode *)local_48.ptr != (GroupNode *)0x0) {
          (*(((Node *)&(local_48.ptr)->super_RefCount)->super_RefCount)._vptr_RefCount[2])();
        }
        SceneGraph::calculateStatistics((Statistics *)local_128,&local_48);
        SceneGraph::Statistics::print((Statistics *)local_128);
        if ((GroupNode *)local_48.ptr != (GroupNode *)0x0) {
          (*(((Node *)&(local_48.ptr)->super_RefCount)->super_RefCount)._vptr_RefCount[3])();
        }
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
        std::ostream::put(-0x30);
        std::ostream::flush();
      }
      local_50.ptr = (this->scene).ptr;
      if (local_50.ptr != (GroupNode *)0x0) {
        (*((local_50.ptr)->super_Node).super_RefCount._vptr_RefCount[2])();
      }
      SceneGraph::flatten((SceneGraph *)&local_148,&local_50,this->instancing_mode);
      if (local_50.ptr != (GroupNode *)0x0) {
        (*((local_50.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
      }
      pAVar7 = Application::instance;
      local_128 = (undefined1  [8])(local_128 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_128,"flattening scene done","");
      Application::log(pAVar7,(double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02));
      if (local_128 != (undefined1  [8])(local_128 + 0x10)) {
        operator_delete((void *)local_128);
      }
      if (0 < (this->super_TutorialApplication).super_Application.verbosity) {
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
        std::ostream::put(-0x30);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"scene statistics (post-flattening):",0x23);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
        std::ostream::put(-0x30);
        std::ostream::flush();
        local_58.ptr = (Node *)local_148._M_dataplus._M_p;
        if ((pointer)local_148._M_dataplus._M_p != (pointer)0x0) {
          (*(code *)((*(MaterialNode **)local_148._M_dataplus._M_p)->super_Node).fileName.
                    _M_dataplus._M_p)();
        }
        SceneGraph::calculateStatistics((Statistics *)local_128,&local_58);
        SceneGraph::Statistics::print((Statistics *)local_128);
        if (local_58.ptr != (Node *)0x0) {
          (*(code *)(((MaterialNode *)((local_58.ptr)->super_RefCount)._vptr_RefCount)->super_Node).
                    fileName._M_string_length)();
        }
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
        std::ostream::put(-0x30);
        std::ostream::flush();
      }
      local_60.ptr = (GroupNode *)local_148._M_dataplus._M_p;
      if ((pointer)local_148._M_dataplus._M_p != (pointer)0x0) {
        (*(code *)((*(MaterialNode **)local_148._M_dataplus._M_p)->super_Node).fileName._M_dataplus.
                  _M_p)();
      }
      this_00 = &(this->super_TutorialApplication).field_0x318;
      TutorialScene::add((TutorialScene *)this_00,&local_60);
      if (local_60.ptr != (GroupNode *)0x0) {
        (*(code *)(((MaterialNode *)((local_60.ptr)->super_Node).super_RefCount._vptr_RefCount)->
                  super_Node).fileName._M_string_length)();
      }
      if ((pointer)local_148._M_dataplus._M_p != (pointer)0x0) {
        (*(code *)((*(MaterialNode **)local_148._M_dataplus._M_p)->super_Node).fileName.
                  _M_string_length)();
      }
      local_148._M_dataplus._M_p = (pointer)0x0;
      pGVar3 = (this->scene).ptr;
      if (pGVar3 != (GroupNode *)0x0) {
        (*(pGVar3->super_Node).super_RefCount._vptr_RefCount[3])();
      }
      (this->scene).ptr = (GroupNode *)0x0;
      pAVar7 = Application::instance;
      local_128 = (undefined1  [8])(local_128 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_128,"populating tutorial scene done","");
      Application::log(pAVar7,(double)CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03));
      if (local_128 != (undefined1  [8])(local_128 + 0x10)) {
        operator_delete((void *)local_128);
      }
      if (this->print_scene_cameras == true) {
        TutorialScene::print_camera_names((TutorialScene *)this_00);
      }
      else {
        iVar8 = std::__cxx11::string::compare((char *)&this->camera_name);
        if (iVar8 == 0) {
          if ((this->super_TutorialApplication).command_line_camera == false) {
            TutorialScene::getDefaultCamera((TutorialScene *)local_168);
            if ((PerspectiveCameraNode *)local_168._0_8_ != (PerspectiveCameraNode *)0x0) {
              (*(((Node *)local_168._0_8_)->super_RefCount)._vptr_RefCount[0x10])(0,local_128);
              (this->super_TutorialApplication).camera.from.field_0.m128[0] = (float)local_128._0_4_
              ;
              (this->super_TutorialApplication).camera.from.field_0.m128[1] = (float)local_128._4_4_
              ;
              (this->super_TutorialApplication).camera.from.field_0.m128[2] = fStack_120;
              (this->super_TutorialApplication).camera.from.field_0.m128[3] = fStack_11c;
              (this->super_TutorialApplication).camera.to.field_0.m128[0] =
                   (float)local_118._M_allocated_capacity._0_4_;
              (this->super_TutorialApplication).camera.to.field_0.m128[1] =
                   (float)local_118._M_allocated_capacity._4_4_;
              (this->super_TutorialApplication).camera.to.field_0.m128[2] = (float)local_118._8_4_;
              (this->super_TutorialApplication).camera.to.field_0.m128[3] = (float)local_118._12_4_;
              (this->super_TutorialApplication).camera.up.field_0.m128[0] = local_108;
              (this->super_TutorialApplication).camera.up.field_0.m128[1] = fStack_104;
              (this->super_TutorialApplication).camera.up.field_0.m128[2] = fStack_100;
              (this->super_TutorialApplication).camera.up.field_0.m128[3] = fStack_fc;
              (this->super_TutorialApplication).camera.fov = local_f8;
              iVar8 = (*(((Node *)local_168._0_8_)->super_RefCount)._vptr_RefCount[0xf])();
              if ((char)iVar8 != '\0') {
                if ((PerspectiveCameraNode *)local_168._0_8_ != (PerspectiveCameraNode *)0x0) {
                  (*(((Node *)local_168._0_8_)->super_RefCount)._vptr_RefCount[2])();
                }
                pPVar5 = (this->super_TutorialApplication).animated_camera.ptr;
                if (pPVar5 != (PerspectiveCameraNode *)0x0) {
                  (*(pPVar5->super_Node).super_RefCount._vptr_RefCount[3])();
                }
                (this->super_TutorialApplication).animated_camera.ptr =
                     (PerspectiveCameraNode *)local_168._0_8_;
              }
            }
            if ((PerspectiveCameraNode *)local_168._0_8_ != (PerspectiveCameraNode *)0x0) {
              (*(((Node *)local_168._0_8_)->super_RefCount)._vptr_RefCount[3])();
            }
          }
        }
        else {
          TutorialScene::getCamera((TutorialScene *)local_168,(string *)this_00);
          (*(((Node *)local_168._0_8_)->super_RefCount)._vptr_RefCount[0x10])(0,local_128);
          (this->super_TutorialApplication).camera.from.field_0.m128[0] = (float)local_128._0_4_;
          (this->super_TutorialApplication).camera.from.field_0.m128[1] = (float)local_128._4_4_;
          (this->super_TutorialApplication).camera.from.field_0.m128[2] = fStack_120;
          (this->super_TutorialApplication).camera.from.field_0.m128[3] = fStack_11c;
          (this->super_TutorialApplication).camera.to.field_0.m128[0] =
               (float)local_118._M_allocated_capacity._0_4_;
          (this->super_TutorialApplication).camera.to.field_0.m128[1] =
               (float)local_118._M_allocated_capacity._4_4_;
          (this->super_TutorialApplication).camera.to.field_0.m128[2] = (float)local_118._8_4_;
          (this->super_TutorialApplication).camera.to.field_0.m128[3] = (float)local_118._12_4_;
          (this->super_TutorialApplication).camera.up.field_0.m128[0] = local_108;
          (this->super_TutorialApplication).camera.up.field_0.m128[1] = fStack_104;
          (this->super_TutorialApplication).camera.up.field_0.m128[2] = fStack_100;
          (this->super_TutorialApplication).camera.up.field_0.m128[3] = fStack_fc;
          (this->super_TutorialApplication).camera.fov = local_f8;
          iVar8 = (*(((Node *)local_168._0_8_)->super_RefCount)._vptr_RefCount[0xf])();
          if ((char)iVar8 != '\0') {
            if ((PerspectiveCameraNode *)local_168._0_8_ != (PerspectiveCameraNode *)0x0) {
              (*(((Node *)local_168._0_8_)->super_RefCount)._vptr_RefCount[2])();
            }
            pPVar5 = (this->super_TutorialApplication).animated_camera.ptr;
            if (pPVar5 != (PerspectiveCameraNode *)0x0) {
              (*(pPVar5->super_Node).super_RefCount._vptr_RefCount[3])();
            }
            (this->super_TutorialApplication).animated_camera.ptr =
                 (PerspectiveCameraNode *)local_168._0_8_;
          }
          if ((PerspectiveCameraNode *)local_168._0_8_ != (PerspectiveCameraNode *)0x0) {
            (*(((Node *)local_168._0_8_)->super_RefCount)._vptr_RefCount[3])();
          }
        }
        TutorialApplication::set_scene(&this->super_TutorialApplication,(TutorialScene *)this_00);
        pAVar7 = Application::instance;
        local_128 = (undefined1  [8])(local_128 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_128,"creating ISPC compatible scene done","");
        iVar8 = 1;
        Application::log(pAVar7,(double)CONCAT44(extraout_XMM0_Db_04,extraout_XMM0_Da_04));
        argv_00 = extraout_RDX;
        if (local_128 != (undefined1  [8])(local_128 + 0x10)) {
          operator_delete((void *)local_128);
          argv_00 = extraout_RDX_00;
        }
        TutorialApplication::run(&this->super_TutorialApplication,iVar8,argv_00);
      }
      if ((pointer)local_148._M_dataplus._M_p != (pointer)0x0) {
        (*(code *)((*(MaterialNode **)local_148._M_dataplus._M_p)->super_Node).fileName.
                  _M_string_length)();
      }
      return 0;
    }
    if (*(long *)(p_Var12 + 1) == 0) {
      std::__throw_bad_function_call();
      goto switchD_00127ff0_default;
    }
    (**(code **)((long)p_Var12 + 0x18))(p_Var12);
    p_Var12 = p_Var12 + 2;
  } while( true );
}

Assistant:

int SceneLoadingTutorialApplication::main(int argc, char** argv) try
  {
    /* parse command line options */
    parseCommandLine(argc,argv);

    /* callback */
    try {
      postParseCommandLine();
    }
    catch (const std::exception& e) {
      std::cout << "Error: " << e.what() << std::endl;
    }

    /* create embree device */
    create_device();
    
    log(1,"application start");

    /* execute postponed scene graph operations */
    for (auto& f : futures) f();
    
    /* load scene */
    if (sceneFilename.size())
    {
      for (auto& file : sceneFilename)
      {
        if (toLowerCase(file.ext()) == std::string("obj"))
          scene->add(loadOBJ(file,subdiv_mode != ""));
        else if (file.ext() != "")
          scene->add(SceneGraph::load(file));
      }
    }

    Application::instance->log(1,"loading scene done");

    /* load key frames for animation */
    for (size_t i=0; i<keyFramesFilenames.size(); i++)
    {
      if (verbosity >= 1) 
        std::cout << "Adding ["<< keyFramesFilenames[i] << "] to scene..." << std::flush;
      
      if (toLowerCase(keyFramesFilenames[i].ext()) == std::string("obj"))
        scene->add(loadOBJ(keyFramesFilenames[i],subdiv_mode != "",true));
      else if (keyFramesFilenames[i].ext() != "")
        scene->add(SceneGraph::load(keyFramesFilenames[i]));
      
      if (verbosity >= 1) 
        std::cout << " [DONE]" << std::endl << std::flush;
    }

    /* clear texture cache */
    Texture::clearTextureCache();

    /* perform removals */
    if (remove_mblur)     scene->remove_mblur(true);
    if (remove_non_mblur) scene->remove_mblur(false);

    /* perform conversions */
    if (sgop.size() && verbosity >= 1) {
      std::cout << std::endl;
      std::cout << "scene statistics (pre-convert):" << std::endl;
      SceneGraph::calculateStatistics(scene.dynamicCast<SceneGraph::Node>()).print();
      std::cout << std::endl;
    }

    /* perform scene graph conversions */
    for (auto& op : sgop)
    {
      switch (op) {
      case CONVERT_TRIANGLES_TO_QUADS   : scene->triangles_to_quads(convert_tris_to_quads_prop); break;
      case CONVERT_BEZIER_TO_LINES      : scene->bezier_to_lines(); break;
      case CONVERT_BEZIER_TO_BSPLINE    : scene->bezier_to_bspline(); break;
      case CONVERT_BSPLINE_TO_BEZIER    : scene->bspline_to_bezier(); break;
      case CONVERT_BEZIER_TO_HERMITE    : scene->bezier_to_hermite(); break;
      case CONVERT_FLAT_TO_ROUND_CURVES : scene->flat_to_round_curves(); break;
      case CONVERT_ROUND_TO_FLAT_CURVES : scene->round_to_flat_curves(); break;
      case MERGE_QUADS_TO_GRIDS         : scene->merge_quads_to_grids(); break;
      case CONVERT_QUADS_TO_GRIDS       : scene->quads_to_grids(grid_resX,grid_resY); break;
      case CONVERT_GRIDS_TO_QUADS       : scene->grids_to_quads(); break;
      case CONVERT_MBLUR_TO_NONMBLUR    : convert_mblur_to_nonmblur(scene.dynamicCast<SceneGraph::Node>()); break;
      default : throw std::runtime_error("unsupported scene graph operation");
      }
    }
    Application::instance->log(1,"converting scene done");

    if (verbosity >= 1) {
      std::cout << std::endl;
      std::cout << "scene statistics (pre-flattening):" << std::endl;
      SceneGraph::calculateStatistics(scene.dynamicCast<SceneGraph::Node>()).print();
      std::cout << std::endl;
    }
    
    Ref<SceneGraph::GroupNode> flattened_scene = SceneGraph::flatten(scene,instancing_mode);
    Application::instance->log(1,"flattening scene done");

    if (verbosity >= 1) {
      std::cout << std::endl;
      std::cout << "scene statistics (post-flattening):" << std::endl;
      SceneGraph::calculateStatistics(flattened_scene.dynamicCast<SceneGraph::Node>()).print();
      std::cout << std::endl;
    }

    /* convert model */
    obj_scene.add(flattened_scene);
    flattened_scene = nullptr;
    scene = nullptr;
    Application::instance->log(1,"populating tutorial scene done");
    
    /* print all cameras */
    if (print_scene_cameras) {
      obj_scene.print_camera_names();
      return 0;
    }

    /* use specified camera */
    if (camera_name != "") {
      auto cam = obj_scene.getCamera(camera_name);
      camera = Camera(cam->get(0),camera.handedness);
      if (cam->isAnimated()) animated_camera = cam;
    }

    /* otherwise use default camera */
    else if (!command_line_camera) {
      auto cam = obj_scene.getDefaultCamera();
      if (cam) {
        camera = Camera(cam->get(0),camera.handedness);
        if (cam->isAnimated()) animated_camera = cam;
      }
    }

    /* send model */
    set_scene(&obj_scene);
    Application::instance->log(1,"creating ISPC compatible scene done");

    /* start tutorial */
    run(argc,argv);

    return 0;
  }
  catch (const std::exception& e) {
    std::cout << "Error: " << e.what() << std::endl;
    return 1;
  }
  catch (...) {
    std::cout << "Error: unknown exception caught." << std::endl;
    return 1;
  }